

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_handshake_message
              (ptls_t *tls,ptls_buffer_t *sendbuf,ptls_iovec_t message,
              ptls_handshake_properties_t *properties)

{
  uint8_t uVar1;
  int local_38;
  int ret;
  uint8_t type;
  ptls_handshake_properties_t *properties_local;
  ptls_buffer_t *sendbuf_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  uVar1 = *message.base;
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    if (uVar1 == '\x02') {
      local_38 = client_handle_hello(tls,message);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (uVar1 == '\b') {
      local_38 = client_handle_encrypted_extensions(tls,message,properties);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (uVar1 == '\v') {
      local_38 = client_handle_certificate(tls,message);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (uVar1 == '\x0f') {
      local_38 = client_handle_certificate_verify(tls,message);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (uVar1 == '\x14') {
      local_38 = client_handle_finished(tls,sendbuf,message);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    if (uVar1 == '\x01') {
      local_38 = server_handle_hello(tls,sendbuf,message);
    }
    else {
      local_38 = 0x28;
    }
    break;
  case PTLS_STATE_SERVER_EXPECT_FINISHED:
    if (uVar1 == '\x14') {
      local_38 = server_handle_finished(tls,message);
    }
    else {
      local_38 = 0x28;
    }
    break;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (uVar1 == '\x04') {
      local_38 = client_handle_new_session_ticket(tls,message);
    }
    else {
      local_38 = 10;
    }
    break;
  case PTLS_STATE_SERVER_POST_HANDSHAKE:
    local_38 = 10;
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                  ,0x860,
                  "int handle_handshake_message(ptls_t *, ptls_buffer_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  return local_38;
}

Assistant:

static int handle_handshake_message(ptls_t *tls, ptls_buffer_t *sendbuf, ptls_iovec_t message,
                                    ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO) {
            ret = client_handle_hello(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = client_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = client_handle_finished(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO) {
            ret = server_handle_hello(tls, sendbuf, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        break;
    default:
        assert(!"unexpected state");
        break;
    }

    return ret;
}